

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O1

AnalyzedScope * __thiscall
slang::analysis::AnalysisManager::getAnalyzedScope(AnalysisManager *this,Scope *scope)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  uint uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  group_access_pointer pgVar6;
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint k;
  uint uVar11;
  uint uVar12;
  AnalyzedScope *pAVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  undefined1 auVar20 [16];
  __int_type_conflict local_48;
  __int_type_conflict _Stack_47;
  __int_type_conflict _Stack_46;
  __int_type_conflict _Stack_45;
  
  if (*(char *)(in_FS_OFFSET + -0x10) == '\0') {
    LOCK();
    UNLOCK();
    iVar8 = (int)boost::unordered::detail::foa::
                 concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
                 ::thread_counter;
    boost::unordered::detail::foa::
    concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
    ::thread_counter =
         boost::unordered::detail::foa::
         concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
         ::thread_counter + 1;
    *(ulong *)(in_FS_OFFSET + -0x18) = (ulong)(iVar8 + 1U & 0x7f);
    *(undefined1 *)(in_FS_OFFSET + -0x10) = 1;
  }
  uVar18 = (ulong)((this->analyzedScopes).table_.mutexes.mutexes.buf + 0x3f) & 0xffffffffffffffc0;
  lVar15 = *(long *)(in_FS_OFFSET + -0x18) * 0x40;
  uVar11 = 0;
  do {
    uVar12 = *(uint *)(lVar15 + uVar18);
    if (uVar12 < 0x3fffffff) {
      LOCK();
      bVar19 = uVar12 == *(uint *)(lVar15 + uVar18);
      if (bVar19) {
        *(uint *)(lVar15 + uVar18) = uVar12 + 1;
      }
      UNLOCK();
      if (bVar19) break;
    }
    boost::unordered::detail::foa::rw_spinlock::yield(uVar11);
    uVar11 = uVar11 + 1;
  } while( true );
  auVar7._8_8_ = 0;
  auVar7._0_8_ = scope;
  uVar10 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar16 = uVar10 >> ((byte)(this->analyzedScopes).table_.
                            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .arrays.
                            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .groups_size_index & 0x3f);
  uVar2 = *(undefined4 *)
           (boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
            match_word(unsigned_long)::word + (uVar10 & 0xff) * 4);
  pAVar13 = (AnalyzedScope *)0x0;
  uVar14 = 0;
LAB_00149f6d:
  pgVar4 = (this->analyzedScopes).table_.
           super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .arrays.
           super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .groups_;
  pgVar1 = pgVar4 + uVar16;
  local_48 = (__int_type_conflict)uVar2;
  _Stack_47 = (__int_type_conflict)((uint)uVar2 >> 8);
  _Stack_46 = (__int_type_conflict)((uint)uVar2 >> 0x10);
  _Stack_45 = (__int_type_conflict)((uint)uVar2 >> 0x18);
  auVar20[0] = -(pgVar1->m[0].n.super___atomic_base<unsigned_char>._M_i == local_48);
  auVar20[1] = -(pgVar1->m[1].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
  auVar20[2] = -(pgVar1->m[2].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
  auVar20[3] = -(pgVar1->m[3].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
  auVar20[4] = -(pgVar1->m[4].n.super___atomic_base<unsigned_char>._M_i == local_48);
  auVar20[5] = -(pgVar1->m[5].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
  auVar20[6] = -(pgVar1->m[6].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
  auVar20[7] = -(pgVar1->m[7].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
  auVar20[8] = -(pgVar1->m[8].n.super___atomic_base<unsigned_char>._M_i == local_48);
  auVar20[9] = -(pgVar1->m[9].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
  auVar20[10] = -(pgVar1->m[10].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
  auVar20[0xb] = -(pgVar1->m[0xb].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
  auVar20[0xc] = -(pgVar1->m[0xc].n.super___atomic_base<unsigned_char>._M_i == local_48);
  auVar20[0xd] = -(pgVar1->m[0xd].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
  auVar20[0xe] = -(pgVar1->m[0xe].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
  auVar20[0xf] = -(pgVar1->m[0xf].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
  uVar11 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
  if (uVar11 != 0) {
    ppVar5 = (this->analyzedScopes).table_.
             super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .arrays.
             super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .elements_;
    pgVar6 = (this->analyzedScopes).table_.
             super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .arrays.group_accesses_;
    uVar12 = 0;
    do {
      uVar3 = pgVar6[uVar16].m.state_.super___atomic_base<unsigned_int>._M_i;
      if (uVar3 < 0x3fffffff) {
        LOCK();
        bVar19 = uVar3 == pgVar6[uVar16].m.state_.super___atomic_base<unsigned_int>._M_i;
        if (bVar19) {
          pgVar6[uVar16].m.state_.super___atomic_base<unsigned_int>._M_i = uVar3 + 1;
        }
        UNLOCK();
        if (bVar19) goto LAB_00149fec;
      }
      boost::unordered::detail::foa::rw_spinlock::yield(uVar12);
      uVar12 = uVar12 + 1;
    } while( true );
  }
  goto LAB_0014a041;
  while (uVar11 != 0) {
LAB_00149fec:
    uVar12 = 0;
    if (uVar11 != 0) {
      for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    uVar9 = (ulong)uVar12;
    if ((pgVar4[uVar16].m[uVar9].n.super___atomic_base<unsigned_char>._M_i == '\0') ||
       (ppVar5[uVar16 * 0xf + uVar9].first != scope)) {
      uVar11 = uVar11 - 1 & uVar11;
      bVar19 = true;
    }
    else {
      if (ppVar5[uVar16 * 0xf + uVar9].second.
          super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>._M_payload.
          super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>._M_engaged == true) {
        pAVar13 = ppVar5[uVar16 * 0xf + uVar9].second.
                  super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>.
                  _M_payload.super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>.
                  _M_payload._M_value;
      }
      bVar19 = false;
    }
    if (!bVar19) {
      LOCK();
      pgVar6[uVar16].m.state_.super___atomic_base<unsigned_int>._M_i =
           pgVar6[uVar16].m.state_.super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
      goto LAB_0014a059;
    }
  }
  LOCK();
  pgVar6[uVar16].m.state_.super___atomic_base<unsigned_int>._M_i =
       pgVar6[uVar16].m.state_.super___atomic_base<unsigned_int>._M_i - 1;
  UNLOCK();
  if (bVar19) {
LAB_0014a041:
    bVar19 = (*(byte *)((long)&boost::unordered::detail::foa::
                               group15<boost::unordered::detail::foa::atomic_integral>::
                               is_not_overflowed(unsigned_long)::shift + (ulong)((uint)uVar10 & 7))
             & pgVar4[uVar16].m[0xf].n.super___atomic_base<unsigned_char>._M_i) != 0;
  }
  else {
LAB_0014a059:
    bVar19 = false;
  }
  if (!bVar19) goto LAB_0014a07d;
  uVar9 = (this->analyzedScopes).table_.
          super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
          .arrays.
          super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
          .groups_size_mask;
  lVar17 = uVar16 + uVar14;
  uVar14 = uVar14 + 1;
  uVar16 = lVar17 + 1U & uVar9;
  if (uVar9 < uVar14) {
LAB_0014a07d:
    LOCK();
    *(int *)(lVar15 + uVar18) = *(int *)(lVar15 + uVar18) + -1;
    UNLOCK();
    return pAVar13;
  }
  goto LAB_00149f6d;
}

Assistant:

const AnalyzedScope* AnalysisManager::getAnalyzedScope(const Scope& scope) {
    const AnalyzedScope* result = nullptr;
    analyzedScopes.cvisit(&scope, [&result](auto& item) {
        if (item.second)
            result = *item.second;
    });
    return result;
}